

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

int __thiscall google::protobuf::SourceCodeInfo::ByteSize(SourceCodeInfo *this)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  uint value;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = (this->location_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar3) {
    lVar4 = 0;
    do {
      value = SourceCodeInfo_Location::ByteSize
                        ((SourceCodeInfo_Location *)
                         (this->location_).super_RepeatedPtrFieldBase.elements_[lVar4]);
      iVar2 = 1;
      if (0x7f < value) {
        iVar2 = io::CodedOutputStream::VarintSize32Fallback(value);
      }
      iVar3 = iVar3 + value + iVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->location_).super_RepeatedPtrFieldBase.current_size_);
  }
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar2 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar3 = iVar3 + iVar2;
  }
  this->_cached_size_ = iVar3;
  return iVar3;
}

Assistant:

int SourceCodeInfo::ByteSize() const {
  int total_size = 0;

  // repeated .google.protobuf.SourceCodeInfo.Location location = 1;
  total_size += 1 * this->location_size();
  for (int i = 0; i < this->location_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->location(i));
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}